

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

bool unodb::unlock_and_return(read_critical_section *cs,bool ret)

{
  optimistic_lock *this;
  bool bVar1;
  atomic<long> *paVar2;
  version_type other;
  byte local_101;
  bool ret_local;
  read_critical_section *cs_local;
  bool result;
  bool result_1;
  bool result_2;
  version_type local_68;
  long local_60;
  __int_type_conflict old_value;
  long local_50;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined4 local_34;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic<long> *local_10;
  
  this = cs->lock;
  local_68.version = (cs->version).version;
  paVar2 = &this->read_lock_count;
  local_44 = 2;
  ___b = paVar2;
  local_48 = std::operator&(acquire,__memory_order_mask);
  if (local_44 - 1U < 2) {
    local_50 = (paVar2->super___atomic_base<long>)._M_i;
  }
  else if (local_44 == 5) {
    local_50 = (paVar2->super___atomic_base<long>)._M_i;
  }
  else {
    local_50 = (paVar2->super___atomic_base<long>)._M_i;
  }
  if (local_50 < 1) {
    __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                  ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
  }
  local_34 = 2;
  other = optimistic_lock::atomic_version_type::load_relaxed(&this->version);
  bVar1 = optimistic_lock::version_type::operator==(&local_68,other);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    optimistic_lock::dec_read_lock_count(this);
  }
  if (bVar1) {
    local_10 = &this->read_lock_count;
    local_18 = 1;
    local_1c = 3;
    local_28 = 1;
    LOCK();
    local_60 = (local_10->super___atomic_base<long>)._M_i;
    (local_10->super___atomic_base<long>)._M_i = (local_10->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (local_60 < 1) {
      old_value = (__int_type_conflict)this;
      local_30 = local_60;
      __assert_fail("old_value > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
    }
  }
  cs->lock = (optimistic_lock *)0x0;
  local_101 = ret;
  if (!bVar1) {
    local_101 = 0;
  }
  return (bool)(local_101 & 1);
}

Assistant:

[[nodiscard]] inline bool unlock_and_return(
    const unodb::optimistic_lock::read_critical_section& cs,
    bool ret) noexcept {
  return UNODB_DETAIL_LIKELY(cs.try_read_unlock()) ? ret : false;
}